

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O1

void __thiscall cppcms::impl::cgi::http::add_to_watchdog(http *this)

{
  _Atomic_word *p_Var1;
  element_type *peVar2;
  int iVar3;
  weak_ptr<cppcms::impl::cgi::http> local_38;
  element_type *local_28;
  element_type *local_20;
  
  if (this->in_watchdog_ == false) {
    peVar2 = (this->watchdog_).
             super___shared_ptr<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    self((http *)&stack0xffffffffffffffd8);
    local_38.super___weak_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_28
    ;
    local_38.super___weak_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20;
    if (local_20 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)
                 ((long)&(local_20->super_enable_shared_from_this<cppcms::impl::cgi::connection>).
                         _M_weak_this.
                         super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + 4);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)
                 ((long)&(local_20->super_enable_shared_from_this<cppcms::impl::cgi::connection>).
                         _M_weak_this.
                         super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + 4);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    std::
    _Rb_tree<std::weak_ptr<cppcms::impl::cgi::http>,std::weak_ptr<cppcms::impl::cgi::http>,std::_Identity<std::weak_ptr<cppcms::impl::cgi::http>>,std::owner_less<std::weak_ptr<cppcms::impl::cgi::http>>,std::allocator<std::weak_ptr<cppcms::impl::cgi::http>>>
    ::_M_insert_unique<std::weak_ptr<cppcms::impl::cgi::http>const&>
              ((_Rb_tree<std::weak_ptr<cppcms::impl::cgi::http>,std::weak_ptr<cppcms::impl::cgi::http>,std::_Identity<std::weak_ptr<cppcms::impl::cgi::http>>,std::owner_less<std::weak_ptr<cppcms::impl::cgi::http>>,std::allocator<std::weak_ptr<cppcms::impl::cgi::http>>>
                *)&peVar2->connections_,&local_38);
    if (local_38.super___weak_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_38.super___weak_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
        iVar3 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar3 = (local_38.super___weak_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
        (local_38.super___weak_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count = iVar3 + -1;
      }
      if (iVar3 == 1) {
        (*(local_38.super___weak_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
    if (local_20 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
    }
    this->in_watchdog_ = true;
  }
  return;
}

Assistant:

void add_to_watchdog()
		{
			if(!in_watchdog_) {
				watchdog_->add(self());
				in_watchdog_ = true;
			}
		}